

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_96de3f::Target::DumpPaths(Value *__return_storage_ptr__,Target *this)

{
  Value *pVVar1;
  string local_d8;
  Value local_b8;
  string *local_90;
  string *buildDir;
  Value local_68;
  string *local_40;
  string *sourceDir;
  cmLocalGenerator *local_28;
  cmLocalGenerator *lg;
  Target *local_18;
  Target *this_local;
  Value *paths;
  
  lg._7_1_ = 0;
  local_18 = this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_28 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  local_40 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(local_28);
  RelativeIfUnder((string *)&buildDir,&this->TopSource,local_40);
  Json::Value::Value(&local_68,(string *)&buildDir);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"source");
  Json::Value::operator=(pVVar1,&local_68);
  Json::Value::~Value(&local_68);
  std::__cxx11::string::~string((string *)&buildDir);
  local_90 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_28);
  RelativeIfUnder(&local_d8,&this->TopBuild,local_90);
  Json::Value::Value(&local_b8,&local_d8);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"build");
  Json::Value::operator=(pVVar1,&local_b8);
  Json::Value::~Value(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpPaths()
{
  Json::Value paths = Json::objectValue;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();

  std::string const& sourceDir = lg->GetCurrentSourceDirectory();
  paths["source"] = RelativeIfUnder(this->TopSource, sourceDir);

  std::string const& buildDir = lg->GetCurrentBinaryDirectory();
  paths["build"] = RelativeIfUnder(this->TopBuild, buildDir);

  return paths;
}